

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O3

void gauss_newton(double *rgb,double *coeffs,int it)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  int j;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  runtime_error *this;
  int iVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double *J [3];
  double x [3];
  double residual [3];
  int P [4];
  double J2 [3];
  double J1 [3];
  double J0 [3];
  double *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  double local_d8 [4];
  double local_b8 [4];
  int local_98 [4];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  double local_48 [3];
  
  if (0 < it) {
    iVar6 = 0;
    do {
      local_f8 = local_48;
      local_f0 = local_68;
      local_e8 = local_88;
      eval_residual(coeffs,rgb,local_b8);
      eval_jacobian(coeffs,rgb,&local_f8);
      iVar3 = LUPDecompose(&local_f8,3,1e-15,local_98);
      if (iVar3 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"RGB ",4);
        poVar5 = std::ostream::_M_insert<double>(*rgb);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::ostream::_M_insert<double>(rgb[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::ostream::_M_insert<double>(rgb[2]);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-> ",3);
        poVar5 = std::ostream::_M_insert<double>(*coeffs);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::ostream::_M_insert<double>(coeffs[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        poVar5 = std::ostream::_M_insert<double>(coeffs[2]);
        std::endl<char,std::char_traits<char>>(poVar5);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"LU decomposition failed!");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      LUPSolve(&local_f8,local_98,local_b8,3,local_d8);
      dVar7 = 0.0;
      lVar4 = 0;
      do {
        coeffs[lVar4] = coeffs[lVar4] - local_d8[lVar4];
        pdVar1 = local_b8 + lVar4;
        lVar4 = lVar4 + 1;
        dVar7 = dVar7 + *pdVar1 * *pdVar1;
      } while (lVar4 != 3);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = coeffs[1];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = coeffs[2];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *coeffs;
      auVar2 = vmaxsd_avx(auVar9,auVar2);
      auVar2 = vmaxsd_avx(auVar10,auVar2);
      if (200.0 < auVar2._0_8_) {
        dVar8 = 200.0 / auVar2._0_8_;
        *coeffs = dVar8 * *coeffs;
        coeffs[1] = dVar8 * coeffs[1];
        coeffs[2] = dVar8 * coeffs[2];
        coeffs[3] = coeffs[3];
      }
    } while ((1e-06 <= dVar7) && (iVar6 = iVar6 + 1, iVar6 != it));
  }
  return;
}

Assistant:

void gauss_newton(const double rgb[3], double coeffs[3], int it = 15) {
    double r = 0;
    for (int i = 0; i < it; ++i) {
        double J0[3], J1[3], J2[3], *J[3] = {J0, J1, J2};

        double residual[3];

        eval_residual(coeffs, rgb, residual);
        eval_jacobian(coeffs, rgb, J);

        int P[4];
        int rv = LUPDecompose(J, 3, 1e-15, P);
        if (rv != 1) {
            std::cout << "RGB " << rgb[0] << " " << rgb[1] << " " << rgb[2] << std::endl;
            std::cout << "-> " << coeffs[0] << " " << coeffs[1] << " " << coeffs[2]
                      << std::endl;
            throw std::runtime_error("LU decomposition failed!");
        }

        double x[3];
        LUPSolve(J, P, residual, 3, x);

        r = 0.0;
        for (int j = 0; j < 3; ++j) {
            coeffs[j] -= x[j];
            r += residual[j] * residual[j];
        }
        double max = std::max(std::max(coeffs[0], coeffs[1]), coeffs[2]);

        if (max > 200) {
            for (int j = 0; j < 3; ++j)
                coeffs[j] *= 200 / max;
        }

        if (r < 1e-6)
            break;
    }
}